

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O0

void __thiscall
addrman_tests::caddrinfo_get_tried_bucket::test_method(caddrinfo_get_tried_bucket *this)

{
  span<const_std::byte,_18446744073709551615UL> source;
  bool bVar1;
  undefined1 uVar2;
  string *ip;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar3;
  int bucket_1;
  int j_1;
  int bucket;
  int j;
  NetGroupManager ngm_asmap;
  vector<bool,_std::allocator<bool>_> asmap;
  AddrInfo infoj_1;
  AddrInfo infoj;
  set<int,_std::less<int>,_std::allocator<int>_> buckets;
  AddrInfo info2;
  uint256 nKey2;
  uint256 nKey1;
  AddrInfo info1;
  CNetAddr source1;
  CAddress addr2;
  CAddress addr1;
  char *in_stack_fffffffffffff408;
  lazy_ostream *in_stack_fffffffffffff410;
  char *in_stack_fffffffffffff418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff420;
  HashWriter *in_stack_fffffffffffff428;
  undefined7 in_stack_fffffffffffff430;
  undefined1 in_stack_fffffffffffff437;
  CAddress *in_stack_fffffffffffff438;
  const_string *in_stack_fffffffffffff440;
  CAddress *pCVar4;
  undefined7 in_stack_fffffffffffff448;
  undefined1 in_stack_fffffffffffff44f;
  char *in_stack_fffffffffffff450;
  int in_stack_fffffffffffff458;
  undefined4 in_stack_fffffffffffff45c;
  string *in_stack_fffffffffffff460;
  CAddress *in_stack_fffffffffffff468;
  CAddress *addrIn;
  undefined7 in_stack_fffffffffffff470;
  undefined1 in_stack_fffffffffffff477;
  int in_stack_fffffffffffff490;
  int in_stack_fffffffffffff494;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff498;
  CAddress *nKey;
  undefined7 in_stack_fffffffffffff4a0;
  undefined1 in_stack_fffffffffffff4a7;
  undefined8 in_stack_fffffffffffff4f0;
  uint16_t port;
  const_string local_ac0 [2];
  lazy_ostream local_aa0 [2];
  assertion_result local_a80;
  int local_a44;
  const_string local_a40 [2];
  lazy_ostream local_a20 [2];
  assertion_result local_a00 [2];
  int local_9c8;
  int local_9c4;
  const_string local_9c0 [2];
  lazy_ostream local_9a0 [2];
  assertion_result local_980 [2];
  const_string local_948 [2];
  lazy_ostream local_928 [5];
  assertion_result local_8d8 [2];
  const_string local_8a0 [2];
  lazy_ostream local_880 [2];
  assertion_result local_860 [2];
  lazy_ostream local_828;
  undefined1 local_810 [68];
  undefined4 local_7cc;
  undefined4 local_7c8;
  allocator<char> local_7c3;
  allocator<char> local_7c2;
  allocator<char> local_7c1 [17];
  _Base_ptr local_7b0;
  undefined1 local_7a8;
  _Base_ptr local_7a0;
  undefined1 local_798;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  long local_8;
  
  port = (uint16_t)((ulong)in_stack_fffffffffffff4f0 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::span<const_std::byte,_18446744073709551615UL>::span<const_std::byte,_59UL>
            ((span<const_std::byte,_18446744073709551615UL> *)in_stack_fffffffffffff418,
             (span<const_std::byte,_59UL> *)in_stack_fffffffffffff410);
  source._M_ptr._4_4_ = in_stack_fffffffffffff494;
  source._M_ptr._0_4_ = in_stack_fffffffffffff490;
  source._M_extent._M_extent_value = in_stack_fffffffffffff498._M_extent_value;
  FromBytes(source);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff460,
             (vector<bool,_std::allocator<bool>_> *)
             CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458));
  NetGroupManager::NetGroupManager
            ((NetGroupManager *)in_stack_fffffffffffff408,
             (vector<bool,_std::allocator<bool>_> *)0x30fc89);
  std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff408);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458),in_stack_fffffffffffff450
             ,(allocator<char> *)CONCAT17(in_stack_fffffffffffff44f,in_stack_fffffffffffff448));
  ResolveService((string *)CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458),port);
  CAddress::CAddress(in_stack_fffffffffffff438,
                     (CService *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430),
                     (ServiceFlags)in_stack_fffffffffffff428);
  CService::~CService((CService *)in_stack_fffffffffffff408);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff408);
  std::allocator<char>::~allocator(local_7c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458),in_stack_fffffffffffff450
             ,(allocator<char> *)CONCAT17(in_stack_fffffffffffff44f,in_stack_fffffffffffff448));
  ResolveService((string *)CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458),port);
  CAddress::CAddress(in_stack_fffffffffffff438,
                     (CService *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430),
                     (ServiceFlags)in_stack_fffffffffffff428);
  CService::~CService((CService *)in_stack_fffffffffffff408);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff408);
  std::allocator<char>::~allocator(&local_7c2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458),in_stack_fffffffffffff450
             ,(allocator<char> *)CONCAT17(in_stack_fffffffffffff44f,in_stack_fffffffffffff448));
  ResolveIP(in_stack_fffffffffffff460);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff408);
  std::allocator<char>::~allocator(&local_7c3);
  AddrInfo::AddrInfo((AddrInfo *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
                     in_stack_fffffffffffff468,(CNetAddr *)in_stack_fffffffffffff460);
  local_208 = 0;
  uStack_200 = 0;
  local_218 = 0;
  uStack_210 = 0;
  local_228 = 0;
  uStack_220 = 0;
  local_238 = 0;
  uStack_230 = 0;
  local_248 = 0;
  uStack_240 = 0;
  local_258 = 0;
  uStack_250 = 0;
  local_1f8 = 0;
  HashWriter::HashWriter((HashWriter *)in_stack_fffffffffffff408);
  local_7c8 = 1;
  HashWriter::operator<<((HashWriter *)in_stack_fffffffffffff418,(int *)in_stack_fffffffffffff410);
  HashWriter::GetHash(in_stack_fffffffffffff428);
  local_298 = 0;
  uStack_290 = 0;
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_2d8 = 0;
  uStack_2d0 = 0;
  local_2e8 = 0;
  uStack_2e0 = 0;
  local_288 = 0;
  HashWriter::HashWriter((HashWriter *)in_stack_fffffffffffff408);
  local_7cc = 2;
  HashWriter::operator<<((HashWriter *)in_stack_fffffffffffff418,(int *)in_stack_fffffffffffff410);
  HashWriter::GetHash(in_stack_fffffffffffff428);
  do {
    pCVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,
               (pointer)in_stack_fffffffffffff410,(unsigned_long)in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff44f,in_stack_fffffffffffff448),
               in_stack_fffffffffffff440,(size_t)in_stack_fffffffffffff438,
               (const_string *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff410,(char (*) [1])in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,
               (pointer)in_stack_fffffffffffff410,(unsigned_long)in_stack_fffffffffffff408);
    local_828._vptr_lazy_ostream._4_4_ =
         AddrInfo::GetTriedBucket
                   ((AddrInfo *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
                    (uint256 *)in_stack_fffffffffffff498._M_extent_value,
                    (NetGroupManager *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490)
                   );
    local_828._vptr_lazy_ostream._0_4_ = 0xec;
    in_stack_fffffffffffff418 = "236";
    in_stack_fffffffffffff410 = &local_828;
    in_stack_fffffffffffff408 = "info1.GetTriedBucket(nKey1, ngm_asmap)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_810,&local_828.m_empty,0x256,1,2,
               (undefined1 *)((long)&local_828._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff408);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,
               (pointer)in_stack_fffffffffffff410,(unsigned_long)in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff44f,in_stack_fffffffffffff448),
               in_stack_fffffffffffff440,(size_t)in_stack_fffffffffffff438,
               (const_string *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
    AddrInfo::GetTriedBucket
              ((AddrInfo *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
               (uint256 *)in_stack_fffffffffffff498._M_extent_value,
               (NetGroupManager *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490));
    AddrInfo::GetTriedBucket
              ((AddrInfo *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
               (uint256 *)in_stack_fffffffffffff498._M_extent_value,
               (NetGroupManager *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff418,
               SUB81((ulong)in_stack_fffffffffffff410 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,
               (pointer)in_stack_fffffffffffff410,(unsigned_long)in_stack_fffffffffffff408);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff410,(basic_cstring<const_char> *)in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,
               (pointer)in_stack_fffffffffffff410,(unsigned_long)in_stack_fffffffffffff408);
    in_stack_fffffffffffff408 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_860,local_880,local_8a0,0x25a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff408);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff408);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  AddrInfo::AddrInfo((AddrInfo *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
                     in_stack_fffffffffffff468,(CNetAddr *)in_stack_fffffffffffff460);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,
               (pointer)in_stack_fffffffffffff410,(unsigned_long)in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff44f,in_stack_fffffffffffff448),
               in_stack_fffffffffffff440,(size_t)in_stack_fffffffffffff438,
               (const_string *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
    CService::GetKey(&in_stack_fffffffffffff438->super_CService);
    CService::GetKey(&in_stack_fffffffffffff438->super_CService);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff438,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff418,
               SUB81((ulong)in_stack_fffffffffffff410 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,
               (pointer)in_stack_fffffffffffff410,(unsigned_long)in_stack_fffffffffffff408);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff410,(basic_cstring<const_char> *)in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,
               (pointer)in_stack_fffffffffffff410,(unsigned_long)in_stack_fffffffffffff408);
    in_stack_fffffffffffff408 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8d8,local_928,local_948,0x260,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff408);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff408);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff418);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff418);
    uVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar2);
  do {
    nKey = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,
               (pointer)in_stack_fffffffffffff410,(unsigned_long)in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff44f,in_stack_fffffffffffff448),
               in_stack_fffffffffffff440,(size_t)in_stack_fffffffffffff438,
               (const_string *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
    in_stack_fffffffffffff494 =
         AddrInfo::GetTriedBucket
                   ((AddrInfo *)CONCAT17(uVar2,in_stack_fffffffffffff4a0),(uint256 *)nKey,
                    (NetGroupManager *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490)
                   );
    in_stack_fffffffffffff490 =
         AddrInfo::GetTriedBucket
                   ((AddrInfo *)CONCAT17(uVar2,in_stack_fffffffffffff4a0),(uint256 *)nKey,
                    (NetGroupManager *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490)
                   );
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff418,
               SUB81((ulong)in_stack_fffffffffffff410 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,
               (pointer)in_stack_fffffffffffff410,(unsigned_long)in_stack_fffffffffffff408);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff410,(basic_cstring<const_char> *)in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,
               (pointer)in_stack_fffffffffffff410,(unsigned_long)in_stack_fffffffffffff408);
    in_stack_fffffffffffff408 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_980,local_9a0,local_9c0,0x261,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff408);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff408);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff408);
  for (local_9c4 = 0; local_9c4 < 0xff; local_9c4 = local_9c4 + 1) {
    util::ToString<int>((int *)in_stack_fffffffffffff440);
    std::operator+((char *)in_stack_fffffffffffff420,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff418);
    std::operator+(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
    ResolveService((string *)CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458),
                   (uint16_t)((ulong)pCVar4 >> 0x30));
    CAddress::CAddress(in_stack_fffffffffffff438,
                       (CService *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430),
                       (ServiceFlags)in_stack_fffffffffffff428);
    util::ToString<int>((int *)in_stack_fffffffffffff440);
    std::operator+((char *)in_stack_fffffffffffff420,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff418);
    std::operator+(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
    ResolveIP(in_stack_fffffffffffff460);
    AddrInfo::AddrInfo((AddrInfo *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
                       in_stack_fffffffffffff468,(CNetAddr *)in_stack_fffffffffffff460);
    CNetAddr::~CNetAddr((CNetAddr *)in_stack_fffffffffffff408);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff408);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff408);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff408);
    CAddress::~CAddress((CAddress *)in_stack_fffffffffffff408);
    CService::~CService((CService *)in_stack_fffffffffffff408);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff408);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff408);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff408);
    local_9c8 = AddrInfo::GetTriedBucket
                          ((AddrInfo *)CONCAT17(uVar2,in_stack_fffffffffffff4a0),(uint256 *)nKey,
                           (NetGroupManager *)
                           CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490));
    pVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff418,
                       (value_type_conflict2 *)in_stack_fffffffffffff410);
    local_7a0 = (_Base_ptr)pVar3.first._M_node;
    in_stack_fffffffffffff477 = pVar3.second;
    local_798 = in_stack_fffffffffffff477;
    AddrInfo::~AddrInfo((AddrInfo *)in_stack_fffffffffffff408);
  }
  do {
    addrIn = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,
               (pointer)in_stack_fffffffffffff410,(unsigned_long)in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff44f,in_stack_fffffffffffff448),
               in_stack_fffffffffffff440,(size_t)in_stack_fffffffffffff438,
               (const_string *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
    std::set<int,_std::less<int>,_std::allocator<int>_>::size
              ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff408);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff418,
               SUB81((ulong)in_stack_fffffffffffff410 >> 0x38,0));
    ip = (string *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,
               (pointer)in_stack_fffffffffffff410,(unsigned_long)in_stack_fffffffffffff408);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff410,(basic_cstring<const_char> *)in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,
               (pointer)in_stack_fffffffffffff410,(unsigned_long)in_stack_fffffffffffff408);
    in_stack_fffffffffffff408 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a00,local_a20,local_a40,0x26d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff408);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff408);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_fffffffffffff45c = CONCAT13(bVar1,(int3)in_stack_fffffffffffff45c);
  } while (bVar1);
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff408);
  for (local_a44 = 0; local_a44 < 0xff; local_a44 = local_a44 + 1) {
    util::ToString<int>((int *)in_stack_fffffffffffff440);
    std::operator+((char *)in_stack_fffffffffffff420,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff418);
    std::operator+(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
    ResolveService((string *)CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458),
                   (uint16_t)((ulong)pCVar4 >> 0x30));
    CAddress::CAddress(in_stack_fffffffffffff438,
                       (CService *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430),
                       (ServiceFlags)in_stack_fffffffffffff428);
    util::ToString<int>((int *)in_stack_fffffffffffff440);
    std::operator+((char *)in_stack_fffffffffffff420,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff418);
    std::operator+(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
    ResolveIP(ip);
    AddrInfo::AddrInfo((AddrInfo *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
                       addrIn,(CNetAddr *)ip);
    CNetAddr::~CNetAddr((CNetAddr *)in_stack_fffffffffffff408);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff408);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff408);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff408);
    CAddress::~CAddress((CAddress *)in_stack_fffffffffffff408);
    CService::~CService((CService *)in_stack_fffffffffffff408);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff408);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff408);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff408);
    in_stack_fffffffffffff458 =
         AddrInfo::GetTriedBucket
                   ((AddrInfo *)CONCAT17(uVar2,in_stack_fffffffffffff4a0),(uint256 *)nKey,
                    (NetGroupManager *)CONCAT44(in_stack_fffffffffffff494,in_stack_fffffffffffff490)
                   );
    pVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff418,
                       (value_type_conflict2 *)in_stack_fffffffffffff410);
    local_7b0 = (_Base_ptr)pVar3.first._M_node;
    in_stack_fffffffffffff44f = pVar3.second;
    local_7a8 = in_stack_fffffffffffff44f;
    AddrInfo::~AddrInfo((AddrInfo *)in_stack_fffffffffffff408);
  }
  do {
    pCVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,
               (pointer)in_stack_fffffffffffff410,(unsigned_long)in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff44f,in_stack_fffffffffffff448),
               (const_string *)pCVar4,(size_t)in_stack_fffffffffffff438,
               (const_string *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
    std::set<int,_std::less<int>,_std::allocator<int>_>::size
              ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff408);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff418,
               SUB81((ulong)in_stack_fffffffffffff410 >> 0x38,0));
    in_stack_fffffffffffff438 = (CAddress *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,
               (pointer)in_stack_fffffffffffff410,(unsigned_long)in_stack_fffffffffffff408);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff410,(basic_cstring<const_char> *)in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,
               (pointer)in_stack_fffffffffffff410,(unsigned_long)in_stack_fffffffffffff408);
    in_stack_fffffffffffff408 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_a80,local_aa0,local_ac0,0x279,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff408);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff408);
    in_stack_fffffffffffff437 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff437);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff408);
  AddrInfo::~AddrInfo((AddrInfo *)in_stack_fffffffffffff408);
  AddrInfo::~AddrInfo((AddrInfo *)in_stack_fffffffffffff408);
  CNetAddr::~CNetAddr((CNetAddr *)in_stack_fffffffffffff408);
  CAddress::~CAddress((CAddress *)in_stack_fffffffffffff408);
  CAddress::~CAddress((CAddress *)in_stack_fffffffffffff408);
  NetGroupManager::~NetGroupManager((NetGroupManager *)in_stack_fffffffffffff408);
  std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffff408);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(caddrinfo_get_tried_bucket)
{
    std::vector<bool> asmap = FromBytes(test::data::asmap);
    NetGroupManager ngm_asmap{asmap};

    CAddress addr1 = CAddress(ResolveService("250.1.1.1", 8333), NODE_NONE);
    CAddress addr2 = CAddress(ResolveService("250.1.1.1", 9999), NODE_NONE);

    CNetAddr source1 = ResolveIP("250.1.1.1");


    AddrInfo info1 = AddrInfo(addr1, source1);

    uint256 nKey1 = (HashWriter{} << 1).GetHash();
    uint256 nKey2 = (HashWriter{} << 2).GetHash();

    BOOST_CHECK_EQUAL(info1.GetTriedBucket(nKey1, ngm_asmap), 236);

    // Test: Make sure key actually randomizes bucket placement. A fail on
    //  this test could be a security issue.
    BOOST_CHECK(info1.GetTriedBucket(nKey1, ngm_asmap) != info1.GetTriedBucket(nKey2, ngm_asmap));

    // Test: Two addresses with same IP but different ports can map to
    //  different buckets because they have different keys.
    AddrInfo info2 = AddrInfo(addr2, source1);

    BOOST_CHECK(info1.GetKey() != info2.GetKey());
    BOOST_CHECK(info1.GetTriedBucket(nKey1, ngm_asmap) != info2.GetTriedBucket(nKey1, ngm_asmap));

    std::set<int> buckets;
    for (int j = 0; j < 255; j++) {
        AddrInfo infoj = AddrInfo(
            CAddress(ResolveService("101." + ToString(j) + ".1.1"), NODE_NONE),
            ResolveIP("101." + ToString(j) + ".1.1"));
        int bucket = infoj.GetTriedBucket(nKey1, ngm_asmap);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the different /16 prefix MAY map to more than
    // 8 buckets.
    BOOST_CHECK(buckets.size() > 8);

    buckets.clear();
    for (int j = 0; j < 255; j++) {
        AddrInfo infoj = AddrInfo(
            CAddress(ResolveService("250." + ToString(j) + ".1.1"), NODE_NONE),
            ResolveIP("250." + ToString(j) + ".1.1"));
        int bucket = infoj.GetTriedBucket(nKey1, ngm_asmap);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the different /16 prefix MAY NOT map to more than
    // 8 buckets.
    BOOST_CHECK(buckets.size() == 8);
}